

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_clr(Parser *this)

{
  uint32_t *in_RDI;
  ParserOptions local_c [3];
  
  memset(local_c,0,4);
  ParserOptions::ParserOptions(local_c);
  *in_RDI = local_c[0].flags;
  basic_substring<const_char>::operator=((basic_substring<const_char> *)(in_RDI + 2),(nullptr_t)0x0)
  ;
  basic_substring<char>::operator=((basic_substring<char> *)(in_RDI + 6),(nullptr_t)0x0);
  in_RDI[10] = 0;
  in_RDI[0xb] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  detail::stack<c4::yml::Parser::State,_16UL>::clear
            ((stack<c4::yml::Parser::State,_16UL> *)(in_RDI + 0xe));
  in_RDI[0x27c] = 0;
  in_RDI[0x27d] = 0;
  in_RDI[0x27e] = 0;
  in_RDI[0x27f] = 0;
  in_RDI[0x280] = 0;
  in_RDI[0x281] = 0;
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x282),(nullptr_t)0x0);
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x286),(nullptr_t)0x0);
  in_RDI[0x28a] = 0;
  in_RDI[0x28b] = 0;
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x28c),(nullptr_t)0x0);
  *(undefined1 *)(in_RDI + 0x290) = 0;
  in_RDI[0x292] = 0;
  in_RDI[0x293] = 0;
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x294),(nullptr_t)0x0);
  in_RDI[0x298] = 0;
  in_RDI[0x299] = 0;
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x29a),(nullptr_t)0x0);
  basic_substring<char>::operator=((basic_substring<char> *)(in_RDI + 0x29e),(nullptr_t)0x0);
  in_RDI[0x2a2] = 0;
  in_RDI[0x2a3] = 0;
  in_RDI[0x2a4] = 0;
  in_RDI[0x2a5] = 0;
  in_RDI[0x2a6] = 0;
  in_RDI[0x2a7] = 0;
  basic_substring<const_char>::operator=
            ((basic_substring<const_char> *)(in_RDI + 0x2a8),(nullptr_t)0x0);
  return;
}

Assistant:

void Parser::_clr()
{
    m_options = {};
    m_file = {};
    m_buf = {};
    m_root_id = {};
    m_tree = {};
    m_stack.clear();
    m_state = {};
    m_key_tag_indentation = {};
    m_key_tag2_indentation = {};
    m_key_tag = {};
    m_key_tag2 = {};
    m_val_tag_indentation = {};
    m_val_tag = {};
    m_key_anchor_was_before = {};
    m_key_anchor_indentation = {};
    m_key_anchor = {};
    m_val_anchor_indentation = {};
    m_val_anchor = {};
    m_filter_arena = {};
    m_newline_offsets = {};
    m_newline_offsets_size = {};
    m_newline_offsets_capacity = {};
    m_newline_offsets_buf = {};
}